

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

bool __thiscall CaDiCaL::Solver::flip(Solver *this,int lit)

{
  uint uVar1;
  FILE *pFVar2;
  size_t sVar3;
  long lVar4;
  pointer puVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 extraout_AL_01;
  undefined1 extraout_AL_02;
  undefined1 extraout_AL_03;
  undefined1 extraout_AL_04;
  undefined1 extraout_AL_05;
  undefined1 extraout_AL_06;
  char cVar17;
  undefined1 extraout_AL_07;
  undefined1 extraout_AL_08;
  undefined1 extraout_AL_09;
  undefined1 extraout_AL_10;
  undefined1 extraout_AL_11;
  undefined1 extraout_AL_12;
  undefined1 extraout_AL_13;
  undefined1 extraout_AL_14;
  uint uVar18;
  int iVar19;
  File *file;
  char *__s;
  char *__s_00;
  char *__s_01;
  char cVar20;
  undefined8 in_RCX;
  External *pEVar21;
  External *pEVar22;
  CaDiCaL *pCVar23;
  long *plVar24;
  Solver *pSVar25;
  Internal *pIVar26;
  bool antecedents;
  bool antecedents_00;
  bool antecedents_01;
  bool antecedents_02;
  Internal *this_00;
  uint uVar27;
  External *pEVar28;
  External *pEVar29;
  CaDiCaL *pCVar30;
  Solver *pSVar31;
  Solver *pSVar32;
  undefined1 print;
  char *pcVar33;
  char *pcVar34;
  char *pcVar35;
  Internal *pIVar36;
  undefined1 *this_01;
  bool bVar37;
  bool bVar38;
  
  pEVar22 = (External *)(ulong)(uint)lit;
  bVar37 = this->internal == (Internal *)0x0;
  pFVar2 = (FILE *)this->trace_api_file;
  pEVar21 = (External *)CONCAT71((int7)((ulong)in_RCX >> 8),pFVar2 == (FILE *)0x0 || bVar37);
  if (pFVar2 != (FILE *)0x0 && !bVar37) {
    pEVar21 = pEVar22;
    fprintf(pFVar2,"%s %d\n","flip");
    fflush((FILE *)this->trace_api_file);
  }
  pcVar33 = "bool CaDiCaL::Solver::flip(int)";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)this,"bool CaDiCaL::Solver::flip(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,(char *)pEVar21);
  pEVar29 = this->external;
  if (pEVar29 == (External *)0x0) {
    flip();
LAB_0085e8e7:
    flip();
LAB_0085e8ec:
    flip();
LAB_0085e8f1:
    flip((Solver *)pEVar22);
    pEVar29 = pEVar22;
LAB_0085e8f8:
    flip();
  }
  else {
    if (this->internal == (Internal *)0x0) goto LAB_0085e8e7;
    if ((this->_state & VALID) == 0) goto LAB_0085e8ec;
    if ((lit & 0x7fffffffU) == 0) goto LAB_0085e8f1;
    if (this->_state != SATISFIED) goto LAB_0085e8f8;
    if (pEVar29->propagator == (ExternalPropagator *)0x0) {
      bVar37 = External::flip(pEVar29,lit);
      return bVar37;
    }
  }
  flip();
  pEVar28 = (External *)((ulong)pcVar33 & 0xffffffff);
  bVar37 = *(long *)&pEVar29->max_var == 0;
  pFVar2 = *(FILE **)&(pEVar29->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pEVar22 = (External *)CONCAT71((int7)((ulong)pEVar21 >> 8),pFVar2 == (FILE *)0x0 || bVar37);
  if (pFVar2 != (FILE *)0x0 && !bVar37) {
    pEVar22 = pEVar28;
    fprintf(pFVar2,"%s %d\n","flippable");
    fflush(*(FILE **)&(pEVar29->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pcVar34 = "bool CaDiCaL::Solver::flippable(int)";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar29,"bool CaDiCaL::Solver::flippable(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,(char *)pEVar22);
  pEVar21 = (External *)pEVar29->vsize;
  if (pEVar21 == (External *)0x0) {
    flippable();
LAB_0085e999:
    flippable();
LAB_0085e99e:
    flippable();
LAB_0085e9a3:
    flippable((Solver *)pEVar28);
    pEVar21 = pEVar28;
LAB_0085e9aa:
    flippable();
  }
  else {
    if (*(long *)&pEVar29->max_var == 0) goto LAB_0085e999;
    uVar27 = *(uint *)((long)&pEVar29->internal + 4);
    if ((uVar27 & 0x6e) == 0) goto LAB_0085e99e;
    if (((ulong)pcVar33 & 0x7fffffff) == 0) goto LAB_0085e9a3;
    if (uVar27 != 0x20) goto LAB_0085e9aa;
    if (pEVar21->propagator == (ExternalPropagator *)0x0) {
      bVar37 = External::flippable(pEVar21,(int)pcVar33);
      return bVar37;
    }
  }
  flippable();
  pEVar29 = (External *)((ulong)pcVar34 & 0xffffffff);
  bVar37 = *(long *)&pEVar21->max_var == 0;
  pFVar2 = *(FILE **)&(pEVar21->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pEVar22 = (External *)CONCAT71((int7)((ulong)pEVar22 >> 8),pFVar2 == (FILE *)0x0 || bVar37);
  if (pFVar2 != (FILE *)0x0 && !bVar37) {
    pEVar22 = pEVar29;
    fprintf(pFVar2,"%s %d\n","failed");
    fflush(*(FILE **)&(pEVar21->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar21,"bool CaDiCaL::Solver::failed(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,(char *)pEVar22);
  pEVar28 = (External *)pEVar21->vsize;
  if (pEVar28 == (External *)0x0) {
    failed();
LAB_0085ea41:
    failed();
LAB_0085ea46:
    failed();
LAB_0085ea4b:
    failed((Solver *)pEVar29);
  }
  else {
    if (*(long *)&pEVar21->max_var == 0) goto LAB_0085ea41;
    uVar27 = *(uint *)((long)&pEVar21->internal + 4);
    if ((uVar27 & 0x6e) == 0) goto LAB_0085ea46;
    if (((ulong)pcVar34 & 0x7fffffff) == 0) goto LAB_0085ea4b;
    pEVar29 = pEVar28;
    if (uVar27 == 0x40) {
      bVar37 = External::failed(pEVar28,(int)pcVar34);
      return bVar37;
    }
  }
  failed();
  bVar37 = *(long *)&pEVar29->max_var == 0;
  pFVar2 = *(FILE **)&(pEVar29->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pcVar33 = (char *)CONCAT71((int7)((ulong)pEVar22 >> 8),pFVar2 == (FILE *)0x0 || bVar37);
  if (pFVar2 != (FILE *)0x0 && !bVar37) {
    fprintf(pFVar2,"%s\n","constraint_failed");
    fflush(*(FILE **)&(pEVar29->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pcVar34 = "bool CaDiCaL::Solver::constraint_failed()";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar29,"bool CaDiCaL::Solver::constraint_failed()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar33);
  pEVar22 = (External *)pEVar29->vsize;
  if (pEVar22 == (External *)0x0) {
    constraint_failed();
LAB_0085eacd:
    constraint_failed();
LAB_0085ead2:
    constraint_failed();
  }
  else {
    if (*(long *)&pEVar29->max_var == 0) goto LAB_0085eacd;
    uVar27 = *(uint *)((long)&pEVar29->internal + 4);
    if ((uVar27 & 0x6e) == 0) goto LAB_0085ead2;
    if (uVar27 == 0x40) {
      bVar37 = External::failed_constraint(pEVar22);
      return bVar37;
    }
  }
  constraint_failed();
  pCVar30 = (CaDiCaL *)((ulong)pcVar34 & 0xffffffff);
  bVar37 = *(long *)&pEVar22->max_var == 0;
  pFVar2 = *(FILE **)&(pEVar22->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pCVar23 = (CaDiCaL *)CONCAT71((int7)((ulong)pcVar33 >> 8),pFVar2 == (FILE *)0x0 || bVar37);
  uVar27 = (uint)pcVar34;
  if (pFVar2 != (FILE *)0x0 && !bVar37) {
    pCVar23 = pCVar30;
    fprintf(pFVar2,"%s %d\n","fixed");
    fflush(*(FILE **)&(pEVar22->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pcVar33 = "int CaDiCaL::Solver::fixed(int) const";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar22,"int CaDiCaL::Solver::fixed(int) const",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,(char *)pCVar23);
  plVar24 = (long *)pEVar22->vsize;
  if (plVar24 == (long *)0x0) {
    fixed();
LAB_0085ebb9:
    fixed();
LAB_0085ebbe:
    fixed();
  }
  else {
    if (*(long *)&pEVar22->max_var == 0) goto LAB_0085ebb9;
    if (((ulong)pEVar22->internal & 0x6e00000000) == 0) goto LAB_0085ebbe;
    if (((ulong)pcVar34 & 0x7fffffff) != 0) {
      uVar18 = -uVar27;
      if (0 < (int)uVar27) {
        uVar18 = uVar27;
      }
      cVar17 = '\0';
      if (((int)uVar18 <= (int)plVar24[1]) &&
         (uVar18 = *(uint *)(plVar24[8] + (ulong)uVar18 * 4), uVar18 != 0)) {
        uVar15 = uVar18;
        if ((int)uVar18 < 1) {
          uVar15 = -uVar18;
        }
        uVar16 = -uVar18;
        if (-1 < (int)uVar27) {
          uVar16 = uVar18;
        }
        cVar17 = *(char *)(*(long *)(*plVar24 + 0x1d8) + (ulong)uVar15);
        if (cVar17 == '\0') {
          cVar20 = '\0';
        }
        else {
          cVar20 = '\0';
          if (*(int *)(*(long *)(*plVar24 + 0x2c8) + (ulong)uVar15 * 0x10) == 0) {
            cVar20 = cVar17;
          }
        }
        cVar17 = -cVar20;
        if (-1 < (int)uVar16) {
          cVar17 = cVar20;
        }
      }
      return (bool)cVar17;
    }
  }
  fixed();
  pSVar31 = (Solver *)((ulong)pcVar33 & 0xffffffff);
  pFVar2 = *(FILE **)(pCVar30 + 0x20);
  pSVar25 = (Solver *)
            CONCAT71((int7)((ulong)plVar24 >> 8),
                     pFVar2 == (FILE *)0x0 || *(long *)(pCVar30 + 8) == 0);
  if (pFVar2 != (FILE *)0x0 && *(long *)(pCVar30 + 8) != 0) {
    pSVar25 = pSVar31;
    fprintf(pFVar2,"%s %d\n","phase");
    fflush(*(FILE **)(pCVar30 + 0x20));
  }
  pcVar34 = "void CaDiCaL::Solver::phase(int)";
  require_solver_pointer_to_be_non_zero
            (pCVar30,"void CaDiCaL::Solver::phase(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar25->adding_clause);
  if (*(External **)(pCVar30 + 0x10) == (External *)0x0) {
    phase();
LAB_0085ec51:
    phase();
LAB_0085ec56:
    phase();
  }
  else {
    if (*(long *)(pCVar30 + 8) == 0) goto LAB_0085ec51;
    if (((byte)pCVar30[4] & 0x7e) == 0) goto LAB_0085ec56;
    if (((ulong)pcVar33 & 0x7fffffff) != 0) {
      External::phase(*(External **)(pCVar30 + 0x10),(int)pcVar33);
      return (bool)extraout_AL;
    }
  }
  phase(pSVar31);
  pSVar32 = (Solver *)((ulong)pcVar34 & 0xffffffff);
  bVar37 = pSVar31->internal == (Internal *)0x0;
  pFVar2 = (FILE *)pSVar31->trace_api_file;
  pSVar25 = (Solver *)CONCAT71((int7)((ulong)pSVar25 >> 8),pFVar2 == (FILE *)0x0 || bVar37);
  if (pFVar2 != (FILE *)0x0 && !bVar37) {
    pSVar25 = pSVar32;
    fprintf(pFVar2,"%s %d\n","unphase");
    fflush((FILE *)pSVar31->trace_api_file);
  }
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pSVar31,"void CaDiCaL::Solver::unphase(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar25->adding_clause);
  if (pSVar31->external == (External *)0x0) {
    unphase();
LAB_0085ece9:
    unphase();
LAB_0085ecee:
    unphase();
  }
  else {
    if (pSVar31->internal == (Internal *)0x0) goto LAB_0085ece9;
    if ((pSVar31->_state & (UNSATISFIED|SATISFIED|SOLVING|ADDING|STEADY|CONFIGURING)) == 0)
    goto LAB_0085ecee;
    if (((ulong)pcVar34 & 0x7fffffff) != 0) {
      External::unphase(pSVar31->external,(int)pcVar34);
      return (bool)extraout_AL_00;
    }
  }
  unphase(pSVar32);
  pcVar33 = "void CaDiCaL::Solver::terminate()";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pSVar32,"void CaDiCaL::Solver::terminate()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar25->adding_clause);
  pEVar22 = pSVar32->external;
  if (pEVar22 == (External *)0x0) {
    terminate();
LAB_0085ed32:
    terminate();
  }
  else {
    if (pSVar32->internal == (Internal *)0x0) goto LAB_0085ed32;
    if ((pSVar32->_state & (UNSATISFIED|SATISFIED|SOLVING|ADDING|STEADY|CONFIGURING)) != 0) {
      External::terminate(pEVar22);
      return (bool)extraout_AL_01;
    }
  }
  terminate();
  pEVar21 = pEVar22;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar22,"void CaDiCaL::Solver::connect_terminator(Terminator *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar25->adding_clause);
  sVar3 = pEVar22->vsize;
  if (sVar3 == 0) {
    connect_terminator();
LAB_0085ed89:
    connect_terminator();
LAB_0085ed8e:
    connect_terminator();
  }
  else {
    if (*(long *)&pEVar22->max_var == 0) goto LAB_0085ed89;
    if (((ulong)pEVar22->internal & 0x6e00000000) == 0) goto LAB_0085ed8e;
    if (pcVar33 != (char *)0x0) {
      *(char **)(sVar3 + 0x168) = pcVar33;
      return SUB81(sVar3,0);
    }
  }
  connect_terminator();
  pcVar33 = "void CaDiCaL::Solver::disconnect_terminator()";
  pEVar22 = pEVar21;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar21,"void CaDiCaL::Solver::disconnect_terminator()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar25->adding_clause);
  sVar3 = pEVar21->vsize;
  if (sVar3 == 0) {
    disconnect_terminator();
LAB_0085edd7:
    disconnect_terminator();
  }
  else {
    if (*(long *)&pEVar21->max_var == 0) goto LAB_0085edd7;
    if (((ulong)pEVar21->internal & 0x6e00000000) != 0) {
      *(undefined8 *)(sVar3 + 0x168) = 0;
      return SUB81(sVar3,0);
    }
  }
  disconnect_terminator();
  pEVar21 = pEVar22;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar22,"void CaDiCaL::Solver::connect_learner(Learner *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar25->adding_clause);
  sVar3 = pEVar22->vsize;
  if (sVar3 == 0) {
    connect_learner();
LAB_0085ee2f:
    connect_learner();
LAB_0085ee34:
    connect_learner();
  }
  else {
    if (*(long *)&pEVar22->max_var == 0) goto LAB_0085ee2f;
    if (((ulong)pEVar22->internal & 0x6e00000000) == 0) goto LAB_0085ee34;
    if (pcVar33 != (char *)0x0) {
      *(char **)(sVar3 + 0x170) = pcVar33;
      return SUB81(sVar3,0);
    }
  }
  connect_learner();
  pcVar33 = "void CaDiCaL::Solver::disconnect_learner()";
  pEVar22 = pEVar21;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar21,"void CaDiCaL::Solver::disconnect_learner()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar25->adding_clause);
  sVar3 = pEVar21->vsize;
  if (sVar3 == 0) {
    disconnect_learner();
LAB_0085ee7d:
    disconnect_learner();
  }
  else {
    if (*(long *)&pEVar21->max_var == 0) goto LAB_0085ee7d;
    if (((ulong)pEVar21->internal & 0x6e00000000) != 0) {
      *(undefined8 *)(sVar3 + 0x170) = 0;
      return SUB81(sVar3,0);
    }
  }
  disconnect_learner();
  pEVar21 = pEVar22;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar22,
             "void CaDiCaL::Solver::connect_fixed_listener(FixedAssignmentListener *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar25->adding_clause);
  if (pEVar22->vsize == 0) {
    connect_fixed_listener();
LAB_0085eeeb:
    connect_fixed_listener();
LAB_0085eef0:
    connect_fixed_listener();
  }
  else {
    if (*(long *)&pEVar22->max_var == 0) goto LAB_0085eeeb;
    if (((ulong)pEVar22->internal & 0x6e00000000) == 0) goto LAB_0085eef0;
    if (pcVar33 != (char *)0x0) {
      if (*(long *)(pEVar22->vsize + 0x178) != 0) {
        disconnect_fixed_listener((Solver *)pEVar22);
      }
      sVar3 = pEVar22->vsize;
      *(char **)(sVar3 + 0x178) = pcVar33;
      return SUB81(sVar3,0);
    }
  }
  connect_fixed_listener();
  pcVar33 = "void CaDiCaL::Solver::disconnect_fixed_listener()";
  pEVar22 = pEVar21;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar21,"void CaDiCaL::Solver::disconnect_fixed_listener()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar25->adding_clause);
  sVar3 = pEVar21->vsize;
  if (sVar3 == 0) {
    disconnect_fixed_listener();
LAB_0085ef39:
    disconnect_fixed_listener();
  }
  else {
    if (*(long *)&pEVar21->max_var == 0) goto LAB_0085ef39;
    if (((ulong)pEVar21->internal & 0x6e00000000) != 0) {
      *(undefined8 *)(sVar3 + 0x178) = 0;
      return SUB81(sVar3,0);
    }
  }
  disconnect_fixed_listener();
  pEVar21 = pEVar22;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar22,
             "void CaDiCaL::Solver::connect_external_propagator(ExternalPropagator *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar25->adding_clause);
  if (pEVar22->vsize == 0) {
    connect_external_propagator();
LAB_0085efbe:
    connect_external_propagator();
LAB_0085efc3:
    connect_external_propagator();
  }
  else {
    if (*(long *)&pEVar22->max_var == 0) goto LAB_0085efbe;
    if (((ulong)pEVar22->internal & 0x6e00000000) == 0) goto LAB_0085efc3;
    if (pcVar33 != (char *)0x0) {
      if (*(long *)(pEVar22->vsize + 0x180) != 0) {
        disconnect_external_propagator((Solver *)pEVar22);
      }
      *(char **)(pEVar22->vsize + 0x180) = pcVar33;
      Internal::connect_propagator(*(Internal **)&pEVar22->max_var);
      lVar4 = *(long *)&pEVar22->max_var;
      *(undefined1 *)(lVar4 + 0xe) = 1;
      *(char *)(lVar4 + 0x10) = pcVar33[8];
      return SUB81(lVar4,0);
    }
  }
  connect_external_propagator();
  pcVar33 = "void CaDiCaL::Solver::disconnect_external_propagator()";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar21,"void CaDiCaL::Solver::disconnect_external_propagator()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar25->adding_clause);
  pEVar22 = (External *)pEVar21->vsize;
  if (pEVar22 == (External *)0x0) {
    disconnect_external_propagator();
LAB_0085f035:
    disconnect_external_propagator();
  }
  else {
    if (*(long *)&pEVar21->max_var == 0) goto LAB_0085f035;
    if (((ulong)pEVar21->internal & 0x6e00000000) != 0) {
      if (pEVar22->propagator != (ExternalPropagator *)0x0) {
        External::reset_observed_vars(pEVar22);
      }
      *(undefined8 *)(pEVar21->vsize + 0x180) = 0;
      Internal::set_tainted_literal(*(Internal **)&pEVar21->max_var);
      lVar4 = *(long *)&pEVar21->max_var;
      *(undefined1 *)(lVar4 + 0xe) = 0;
      *(undefined1 *)(lVar4 + 0x10) = 1;
      return SUB81(lVar4,0);
    }
  }
  disconnect_external_propagator();
  pSVar31 = (Solver *)((ulong)pcVar33 & 0xffffffff);
  bVar37 = *(long *)&pEVar22->max_var == 0;
  pFVar2 = *(FILE **)&(pEVar22->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pSVar25 = (Solver *)CONCAT71((int7)((ulong)pSVar25 >> 8),pFVar2 == (FILE *)0x0 || bVar37);
  if (pFVar2 != (FILE *)0x0 && !bVar37) {
    pSVar25 = pSVar31;
    fprintf(pFVar2,"%s %d\n","observe");
    fflush(*(FILE **)&(pEVar22->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pcVar34 = "void CaDiCaL::Solver::add_observed_var(int)";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar22,"void CaDiCaL::Solver::add_observed_var(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar25->adding_clause);
  if ((External *)pEVar22->vsize == (External *)0x0) {
    add_observed_var();
LAB_0085f0c7:
    add_observed_var();
LAB_0085f0cc:
    add_observed_var();
  }
  else {
    if (*(long *)&pEVar22->max_var == 0) goto LAB_0085f0c7;
    if (((ulong)pEVar22->internal & 0x7e00000000) == 0) goto LAB_0085f0cc;
    if (((ulong)pcVar33 & 0x7fffffff) != 0) {
      External::add_observed_var((External *)pEVar22->vsize,(int)pcVar33);
      return (bool)extraout_AL_02;
    }
  }
  add_observed_var(pSVar31);
  pSVar32 = (Solver *)((ulong)pcVar34 & 0xffffffff);
  bVar37 = pSVar31->internal == (Internal *)0x0;
  pFVar2 = (FILE *)pSVar31->trace_api_file;
  pSVar25 = (Solver *)CONCAT71((int7)((ulong)pSVar25 >> 8),pFVar2 == (FILE *)0x0 || bVar37);
  if (pFVar2 != (FILE *)0x0 && !bVar37) {
    pSVar25 = pSVar32;
    fprintf(pFVar2,"%s %d\n","unobserve");
    fflush((FILE *)pSVar31->trace_api_file);
  }
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pSVar31,"void CaDiCaL::Solver::remove_observed_var(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar25->adding_clause);
  if (pSVar31->external == (External *)0x0) {
    remove_observed_var();
LAB_0085f15f:
    remove_observed_var();
LAB_0085f164:
    remove_observed_var();
  }
  else {
    if (pSVar31->internal == (Internal *)0x0) goto LAB_0085f15f;
    if ((pSVar31->_state & VALID) == 0) goto LAB_0085f164;
    if (((ulong)pcVar34 & 0x7fffffff) != 0) {
      External::remove_observed_var(pSVar31->external,(int)pcVar34);
      return (bool)extraout_AL_03;
    }
  }
  remove_observed_var(pSVar32);
  bVar37 = pSVar32->internal == (Internal *)0x0;
  pFVar2 = (FILE *)pSVar32->trace_api_file;
  pcVar33 = (char *)CONCAT71((int7)((ulong)pSVar25 >> 8),pFVar2 == (FILE *)0x0 || bVar37);
  if (pFVar2 != (FILE *)0x0 && !bVar37) {
    fprintf(pFVar2,"%s\n","reset_observed_vars");
    fflush((FILE *)pSVar32->trace_api_file);
  }
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pSVar32,"void CaDiCaL::Solver::reset_observed_vars()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar33);
  pEVar22 = pSVar32->external;
  if (pEVar22 == (External *)0x0) {
    reset_observed_vars();
LAB_0085f1df:
    reset_observed_vars();
  }
  else {
    if (pSVar32->internal == (Internal *)0x0) goto LAB_0085f1df;
    if ((pSVar32->_state & (UNSATISFIED|SATISFIED|SOLVING|ADDING|STEADY|CONFIGURING)) != 0) {
      External::reset_observed_vars(pEVar22);
      return (bool)extraout_AL_04;
    }
  }
  reset_observed_vars();
  bVar37 = *(long *)&pEVar22->max_var == 0;
  pFVar2 = *(FILE **)&(pEVar22->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pcVar33 = (char *)CONCAT71((int7)((ulong)pcVar33 >> 8),pFVar2 == (FILE *)0x0 || bVar37);
  if (pFVar2 != (FILE *)0x0 && !bVar37) {
    fprintf(pFVar2,"%s\n","active");
    fflush(*(FILE **)&(pEVar22->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pEVar21 = pEVar22;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar22,"int CaDiCaL::Solver::active() const",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar33);
  if (pEVar22->vsize == 0) {
    active();
LAB_0085f25b:
    active();
  }
  else {
    if (*(long *)&pEVar22->max_var == 0) goto LAB_0085f25b;
    if (((ulong)pEVar22->internal & 0x6e00000000) != 0) {
      return SUB41(*(undefined4 *)(*(long *)&pEVar22->max_var + 0x15a8),0);
    }
  }
  active();
  bVar37 = *(long *)&pEVar21->max_var == 0;
  pFVar2 = *(FILE **)&(pEVar21->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pcVar33 = (char *)CONCAT71((int7)((ulong)pcVar33 >> 8),pFVar2 == (FILE *)0x0 || bVar37);
  if (pFVar2 != (FILE *)0x0 && !bVar37) {
    fprintf(pFVar2,"%s\n","redundant");
    fflush(*(FILE **)&(pEVar21->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pEVar22 = pEVar21;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar21,"int64_t CaDiCaL::Solver::redundant() const",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar33);
  if (pEVar21->vsize == 0) {
    redundant();
LAB_0085f2d8:
    redundant();
  }
  else {
    if (*(long *)&pEVar21->max_var == 0) goto LAB_0085f2d8;
    if (((ulong)pEVar21->internal & 0x6e00000000) != 0) {
      return SUB81(*(undefined8 *)(*(long *)&pEVar21->max_var + 0x1078),0);
    }
  }
  redundant();
  bVar37 = *(long *)&pEVar22->max_var == 0;
  pFVar2 = *(FILE **)&(pEVar22->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pcVar33 = (char *)CONCAT71((int7)((ulong)pcVar33 >> 8),pFVar2 == (FILE *)0x0 || bVar37);
  if (pFVar2 != (FILE *)0x0 && !bVar37) {
    fprintf(pFVar2,"%s\n","irredundant");
    fflush(*(FILE **)&(pEVar22->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pcVar34 = "int64_t CaDiCaL::Solver::irredundant() const";
  pEVar21 = pEVar22;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar22,"int64_t CaDiCaL::Solver::irredundant() const",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar33);
  if (pEVar22->vsize == 0) {
    irredundant();
LAB_0085f354:
    irredundant();
  }
  else {
    if (*(long *)&pEVar22->max_var == 0) goto LAB_0085f354;
    if (((ulong)pEVar22->internal & 0x6e00000000) != 0) {
      return SUB81(*(undefined8 *)(*(long *)&pEVar22->max_var + 0x1080),0);
    }
  }
  irredundant();
  pSVar31 = (Solver *)((ulong)pcVar34 & 0xffffffff);
  bVar37 = *(long *)&pEVar21->max_var == 0;
  pFVar2 = *(FILE **)&(pEVar21->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pSVar25 = (Solver *)CONCAT71((int7)((ulong)pcVar33 >> 8),pFVar2 == (FILE *)0x0 || bVar37);
  if (pFVar2 != (FILE *)0x0 && !bVar37) {
    pSVar25 = pSVar31;
    fprintf(pFVar2,"%s %d\n","freeze");
    fflush(*(FILE **)&(pEVar21->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pcVar33 = "void CaDiCaL::Solver::freeze(int)";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar21,"void CaDiCaL::Solver::freeze(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar25->adding_clause);
  if ((External *)pEVar21->vsize == (External *)0x0) {
    freeze();
LAB_0085f3e5:
    freeze();
LAB_0085f3ea:
    freeze();
  }
  else {
    if (*(long *)&pEVar21->max_var == 0) goto LAB_0085f3e5;
    if (((ulong)pEVar21->internal & 0x6e00000000) == 0) goto LAB_0085f3ea;
    if (((ulong)pcVar34 & 0x7fffffff) != 0) {
      External::freeze((External *)pEVar21->vsize,(int)pcVar34);
      return (bool)extraout_AL_05;
    }
  }
  freeze(pSVar31);
  pSVar32 = (Solver *)((ulong)pcVar33 & 0xffffffff);
  bVar37 = pSVar31->internal == (Internal *)0x0;
  pFVar2 = (FILE *)pSVar31->trace_api_file;
  pSVar25 = (Solver *)CONCAT71((int7)((ulong)pSVar25 >> 8),pFVar2 == (FILE *)0x0 || bVar37);
  if (pFVar2 != (FILE *)0x0 && !bVar37) {
    pSVar25 = pSVar32;
    fprintf(pFVar2,"%s %d\n","melt");
    fflush((FILE *)pSVar31->trace_api_file);
  }
  pcVar34 = "void CaDiCaL::Solver::melt(int)";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pSVar31,"void CaDiCaL::Solver::melt(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar25->adding_clause);
  pEVar22 = pSVar31->external;
  if (pEVar22 == (External *)0x0) {
LAB_0085f4ac:
    melt();
LAB_0085f4b1:
    melt();
LAB_0085f4b6:
    melt();
  }
  else {
    if (pSVar31->internal == (Internal *)0x0) goto LAB_0085f4b1;
    if ((pSVar31->_state & VALID) == 0) goto LAB_0085f4b6;
    if (((ulong)pcVar33 & 0x7fffffff) != 0) {
      uVar18 = (uint)pcVar33;
      uVar27 = -uVar18;
      if (0 < (int)uVar18) {
        uVar27 = uVar18;
      }
      if ((((int)uVar27 <= pEVar22->max_var) &&
          (pSVar25 = (Solver *)
                     (pEVar22->frozentab).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start,
          (int)uVar27 <
          (int)((ulong)((long)(pEVar22->frozentab).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pSVar25) >> 2))) &&
         (*(int *)(&pSVar25->adding_clause + (ulong)uVar27 * 4) != 0)) {
        External::melt(pEVar22,uVar18);
        return (bool)extraout_AL_06;
      }
      melt(pSVar32);
      goto LAB_0085f4ac;
    }
  }
  melt(pSVar32);
  pCVar30 = (CaDiCaL *)((ulong)pcVar34 & 0xffffffff);
  bVar37 = pSVar32->internal == (Internal *)0x0;
  pFVar2 = (FILE *)pSVar32->trace_api_file;
  pCVar23 = (CaDiCaL *)CONCAT71((int7)((ulong)pSVar25 >> 8),pFVar2 == (FILE *)0x0 || bVar37);
  if (pFVar2 != (FILE *)0x0 && !bVar37) {
    pCVar23 = pCVar30;
    fprintf(pFVar2,"%s %d\n","frozen");
    fflush((FILE *)pSVar32->trace_api_file);
  }
  pcVar33 = "bool CaDiCaL::Solver::frozen(int) const";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pSVar32,"bool CaDiCaL::Solver::frozen(int) const",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,(char *)pCVar23);
  pEVar22 = pSVar32->external;
  if (pEVar22 == (External *)0x0) {
    frozen();
LAB_0085f575:
    frozen();
LAB_0085f57a:
    frozen();
  }
  else {
    if (pSVar32->internal == (Internal *)0x0) goto LAB_0085f575;
    if ((pSVar32->_state & VALID) == 0) goto LAB_0085f57a;
    if (((ulong)pcVar34 & 0x7fffffff) != 0) {
      uVar18 = (uint)pcVar34;
      uVar27 = -uVar18;
      if (0 < (int)uVar18) {
        uVar27 = uVar18;
      }
      if ((pEVar22->max_var < (int)uVar27) ||
         (puVar5 = (pEVar22->frozentab).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
         (int)((ulong)((long)(pEVar22->frozentab).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)puVar5) >> 2) <= (int)uVar27
         )) {
        bVar37 = false;
      }
      else {
        bVar37 = puVar5[uVar27] != 0;
      }
      return bVar37;
    }
  }
  frozen();
  pFVar2 = *(FILE **)(pCVar30 + 0x20);
  pIVar26 = (Internal *)
            CONCAT71((int7)((ulong)pCVar23 >> 8),
                     pFVar2 == (FILE *)0x0 || *(long *)(pCVar30 + 8) == 0);
  if (pFVar2 != (FILE *)0x0 && *(long *)(pCVar30 + 8) != 0) {
    pIVar26 = this_00;
    fprintf(pFVar2,"%s %s\n","trace_proof");
    fflush(*(FILE **)(pCVar30 + 0x20));
  }
  print = 0x10;
  require_solver_pointer_to_be_non_zero
            (pCVar30,"bool CaDiCaL::Solver::trace_proof(FILE *, const char *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,(char *)pIVar26);
  if (*(long *)(pCVar30 + 0x10) == 0) {
    trace_proof();
LAB_0085f622:
    trace_proof();
LAB_0085f627:
    trace_proof();
  }
  else {
    if (*(long *)(pCVar30 + 8) == 0) goto LAB_0085f622;
    if ((*(uint *)(pCVar30 + 4) & 0x6e) == 0) goto LAB_0085f627;
    if (*(uint *)(pCVar30 + 4) == 2) {
      file = (File *)File::write((int)*(long *)(pCVar30 + 8),pcVar33,(size_t)this_00);
      Internal::trace(*(Internal **)(pCVar30 + 8),file);
      return true;
    }
  }
  pIVar36 = this_00;
  trace_proof((Solver *)this_00);
  lVar4._0_1_ = pIVar36->preprocessing;
  lVar4._1_1_ = pIVar36->protected_reasons;
  lVar4._2_1_ = pIVar36->force_saved_phase;
  lVar4._3_1_ = pIVar36->searching_lucky_phases;
  lVar4._4_1_ = pIVar36->stable;
  lVar4._5_1_ = pIVar36->reported;
  lVar4._6_1_ = pIVar36->external_prop;
  lVar4._7_1_ = pIVar36->did_external_prop;
  pFVar2 = (FILE *)(pIVar36->reluctant).v;
  pcVar33 = (char *)CONCAT71((int7)((ulong)pIVar26 >> 8),pFVar2 == (FILE *)0x0 || lVar4 == 0);
  if (pFVar2 != (FILE *)0x0 && lVar4 != 0) {
    fprintf(pFVar2,"%s\n","close_proof_trace");
    fflush((FILE *)(pIVar36->reluctant).v);
  }
  pcVar34 = "void CaDiCaL::Solver::close_proof_trace(bool)";
  pIVar26 = pIVar36;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar36,"void CaDiCaL::Solver::close_proof_trace(bool)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar33);
  lVar6._0_1_ = pIVar36->external_prop_is_lazy;
  lVar6._1_1_ = pIVar36->forced_backt_allowed;
  lVar6._2_1_ = pIVar36->private_steps;
  lVar6._3_1_ = pIVar36->rephased;
  lVar6._4_4_ = *(undefined4 *)&pIVar36->field_0x14;
  if (lVar6 == 0) {
    close_proof_trace();
LAB_0085f6d7:
    close_proof_trace();
LAB_0085f6dc:
    close_proof_trace();
LAB_0085f6e1:
    close_proof_trace();
  }
  else {
    lVar4 = *(long *)&pIVar36->preprocessing;
    if (lVar4 == 0) goto LAB_0085f6d7;
    if ((pIVar36->unsat & 0x6eU) == 0) goto LAB_0085f6dc;
    pcVar33 = *(char **)(lVar4 + 0xc50);
    if (*(char **)(lVar4 + 0xc48) == pcVar33) goto LAB_0085f6e1;
    pIVar26 = *(Internal **)(pcVar33 + -8);
    cVar17 = (**(code **)(*(long *)pIVar26 + 0x98))();
    if (cVar17 == '\0') {
      Internal::close_trace(*(Internal **)&pIVar36->preprocessing,(bool)print);
      return (bool)extraout_AL_07;
    }
  }
  close_proof_trace();
  bVar37 = SUB81(pcVar33,0);
  pcVar35 = "void CaDiCaL::Solver::connect_proof_tracer(Tracer *, bool, bool)";
  pIVar36 = pIVar26;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar26,"void CaDiCaL::Solver::connect_proof_tracer(Tracer *, bool, bool)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar33);
  lVar7._0_1_ = pIVar26->external_prop_is_lazy;
  lVar7._1_1_ = pIVar26->forced_backt_allowed;
  lVar7._2_1_ = pIVar26->private_steps;
  lVar7._3_1_ = pIVar26->rephased;
  lVar7._4_4_ = *(undefined4 *)&pIVar26->field_0x14;
  if (lVar7 == 0) {
    connect_proof_tracer();
LAB_0085f752:
    connect_proof_tracer();
LAB_0085f757:
    connect_proof_tracer();
LAB_0085f75c:
    connect_proof_tracer();
  }
  else {
    pIVar36 = *(Internal **)&pIVar26->preprocessing;
    if (pIVar36 == (Internal *)0x0) goto LAB_0085f752;
    uVar27._0_1_ = pIVar26->unsat;
    uVar27._1_1_ = pIVar26->iterating;
    uVar27._2_1_ = pIVar26->localsearching;
    uVar27._3_1_ = pIVar26->lookingahead;
    if ((uVar27 & 0x6e) == 0) goto LAB_0085f757;
    if (uVar27 != 2) goto LAB_0085f75c;
    if ((Tracer *)pcVar34 != (Tracer *)0x0) {
      Internal::connect_proof_tracer(pIVar36,(Tracer *)pcVar34,antecedents,bVar37);
      return (bool)extraout_AL_08;
    }
  }
  connect_proof_tracer();
  bVar37 = SUB81(pcVar33,0);
  pcVar34 = "void CaDiCaL::Solver::connect_proof_tracer(InternalTracer *, bool, bool)";
  pIVar26 = pIVar36;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar36,
             "void CaDiCaL::Solver::connect_proof_tracer(InternalTracer *, bool, bool)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar33);
  lVar8._0_1_ = pIVar36->external_prop_is_lazy;
  lVar8._1_1_ = pIVar36->forced_backt_allowed;
  lVar8._2_1_ = pIVar36->private_steps;
  lVar8._3_1_ = pIVar36->rephased;
  lVar8._4_4_ = *(undefined4 *)&pIVar36->field_0x14;
  if (lVar8 == 0) {
    connect_proof_tracer();
LAB_0085f7cc:
    connect_proof_tracer();
LAB_0085f7d1:
    connect_proof_tracer();
LAB_0085f7d6:
    connect_proof_tracer();
  }
  else {
    pIVar26 = *(Internal **)&pIVar36->preprocessing;
    if (pIVar26 == (Internal *)0x0) goto LAB_0085f7cc;
    uVar18._0_1_ = pIVar36->unsat;
    uVar18._1_1_ = pIVar36->iterating;
    uVar18._2_1_ = pIVar36->localsearching;
    uVar18._3_1_ = pIVar36->lookingahead;
    if ((uVar18 & 0x6e) == 0) goto LAB_0085f7d1;
    if (uVar18 != 2) goto LAB_0085f7d6;
    if ((InternalTracer *)pcVar35 != (InternalTracer *)0x0) {
      Internal::connect_proof_tracer(pIVar26,(InternalTracer *)pcVar35,antecedents_00,bVar37);
      return (bool)extraout_AL_09;
    }
  }
  connect_proof_tracer();
  bVar37 = SUB81(pcVar33,0);
  pcVar35 = "void CaDiCaL::Solver::connect_proof_tracer(StatTracer *, bool, bool)";
  pIVar36 = pIVar26;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar26,
             "void CaDiCaL::Solver::connect_proof_tracer(StatTracer *, bool, bool)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar33);
  lVar9._0_1_ = pIVar26->external_prop_is_lazy;
  lVar9._1_1_ = pIVar26->forced_backt_allowed;
  lVar9._2_1_ = pIVar26->private_steps;
  lVar9._3_1_ = pIVar26->rephased;
  lVar9._4_4_ = *(undefined4 *)&pIVar26->field_0x14;
  if (lVar9 == 0) {
    connect_proof_tracer();
LAB_0085f846:
    connect_proof_tracer();
LAB_0085f84b:
    connect_proof_tracer();
LAB_0085f850:
    connect_proof_tracer();
  }
  else {
    pIVar36 = *(Internal **)&pIVar26->preprocessing;
    if (pIVar36 == (Internal *)0x0) goto LAB_0085f846;
    uVar15._0_1_ = pIVar26->unsat;
    uVar15._1_1_ = pIVar26->iterating;
    uVar15._2_1_ = pIVar26->localsearching;
    uVar15._3_1_ = pIVar26->lookingahead;
    if ((uVar15 & 0x6e) == 0) goto LAB_0085f84b;
    if (uVar15 != 2) goto LAB_0085f850;
    if ((StatTracer *)pcVar34 != (StatTracer *)0x0) {
      Internal::connect_proof_tracer(pIVar36,(StatTracer *)pcVar34,antecedents_01,bVar37);
      return (bool)extraout_AL_10;
    }
  }
  connect_proof_tracer();
  bVar37 = SUB81(pcVar33,0);
  pcVar34 = "void CaDiCaL::Solver::connect_proof_tracer(FileTracer *, bool, bool)";
  pIVar26 = pIVar36;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar36,
             "void CaDiCaL::Solver::connect_proof_tracer(FileTracer *, bool, bool)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar33);
  lVar10._0_1_ = pIVar36->external_prop_is_lazy;
  lVar10._1_1_ = pIVar36->forced_backt_allowed;
  lVar10._2_1_ = pIVar36->private_steps;
  lVar10._3_1_ = pIVar36->rephased;
  lVar10._4_4_ = *(undefined4 *)&pIVar36->field_0x14;
  if (lVar10 == 0) {
    connect_proof_tracer();
LAB_0085f8c0:
    connect_proof_tracer();
LAB_0085f8c5:
    connect_proof_tracer();
LAB_0085f8ca:
    connect_proof_tracer();
  }
  else {
    pIVar26 = *(Internal **)&pIVar36->preprocessing;
    if (pIVar26 == (Internal *)0x0) goto LAB_0085f8c0;
    uVar16._0_1_ = pIVar36->unsat;
    uVar16._1_1_ = pIVar36->iterating;
    uVar16._2_1_ = pIVar36->localsearching;
    uVar16._3_1_ = pIVar36->lookingahead;
    if ((uVar16 & 0x6e) == 0) goto LAB_0085f8c5;
    if (uVar16 != 2) goto LAB_0085f8ca;
    if ((FileTracer *)pcVar35 != (FileTracer *)0x0) {
      Internal::connect_proof_tracer(pIVar26,(FileTracer *)pcVar35,antecedents_02,bVar37);
      return (bool)extraout_AL_11;
    }
  }
  connect_proof_tracer();
  pcVar35 = "bool CaDiCaL::Solver::disconnect_proof_tracer(Tracer *)";
  pIVar36 = pIVar26;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar26,"bool CaDiCaL::Solver::disconnect_proof_tracer(Tracer *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar33);
  lVar11._0_1_ = pIVar26->external_prop_is_lazy;
  lVar11._1_1_ = pIVar26->forced_backt_allowed;
  lVar11._2_1_ = pIVar26->private_steps;
  lVar11._3_1_ = pIVar26->rephased;
  lVar11._4_4_ = *(undefined4 *)&pIVar26->field_0x14;
  if (lVar11 == 0) {
    disconnect_proof_tracer();
LAB_0085f921:
    disconnect_proof_tracer();
LAB_0085f926:
    disconnect_proof_tracer();
  }
  else {
    pIVar36 = *(Internal **)&pIVar26->preprocessing;
    if (pIVar36 == (Internal *)0x0) goto LAB_0085f921;
    if ((pIVar26->unsat & 0x6eU) == 0) goto LAB_0085f926;
    if ((Tracer *)pcVar34 != (Tracer *)0x0) {
      bVar37 = Internal::disconnect_proof_tracer(pIVar36,(Tracer *)pcVar34);
      return bVar37;
    }
  }
  disconnect_proof_tracer();
  pcVar34 = "bool CaDiCaL::Solver::disconnect_proof_tracer(StatTracer *)";
  pIVar26 = pIVar36;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar36,"bool CaDiCaL::Solver::disconnect_proof_tracer(StatTracer *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar33);
  lVar12._0_1_ = pIVar36->external_prop_is_lazy;
  lVar12._1_1_ = pIVar36->forced_backt_allowed;
  lVar12._2_1_ = pIVar36->private_steps;
  lVar12._3_1_ = pIVar36->rephased;
  lVar12._4_4_ = *(undefined4 *)&pIVar36->field_0x14;
  if (lVar12 == 0) {
    disconnect_proof_tracer();
LAB_0085f97d:
    disconnect_proof_tracer();
LAB_0085f982:
    disconnect_proof_tracer();
  }
  else {
    pIVar26 = *(Internal **)&pIVar36->preprocessing;
    if (pIVar26 == (Internal *)0x0) goto LAB_0085f97d;
    if ((pIVar36->unsat & 0x6eU) == 0) goto LAB_0085f982;
    if ((StatTracer *)pcVar35 != (StatTracer *)0x0) {
      bVar37 = Internal::disconnect_proof_tracer(pIVar26,(StatTracer *)pcVar35);
      return bVar37;
    }
  }
  disconnect_proof_tracer();
  pIVar36 = pIVar26;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar26,"bool CaDiCaL::Solver::disconnect_proof_tracer(FileTracer *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar33);
  lVar13._0_1_ = pIVar26->external_prop_is_lazy;
  lVar13._1_1_ = pIVar26->forced_backt_allowed;
  lVar13._2_1_ = pIVar26->private_steps;
  lVar13._3_1_ = pIVar26->rephased;
  lVar13._4_4_ = *(undefined4 *)&pIVar26->field_0x14;
  if (lVar13 == 0) {
    disconnect_proof_tracer();
LAB_0085f9d9:
    disconnect_proof_tracer();
LAB_0085f9de:
    disconnect_proof_tracer();
  }
  else {
    pIVar36 = *(Internal **)&pIVar26->preprocessing;
    if (pIVar36 == (Internal *)0x0) goto LAB_0085f9d9;
    if ((pIVar26->unsat & 0x6eU) == 0) goto LAB_0085f9de;
    if ((FileTracer *)pcVar34 != (FileTracer *)0x0) {
      bVar37 = Internal::disconnect_proof_tracer(pIVar36,(FileTracer *)pcVar34);
      return bVar37;
    }
  }
  disconnect_proof_tracer();
  lVar14._0_1_ = pIVar36->preprocessing;
  lVar14._1_1_ = pIVar36->protected_reasons;
  lVar14._2_1_ = pIVar36->force_saved_phase;
  lVar14._3_1_ = pIVar36->searching_lucky_phases;
  lVar14._4_1_ = pIVar36->stable;
  lVar14._5_1_ = pIVar36->reported;
  lVar14._6_1_ = pIVar36->external_prop;
  lVar14._7_1_ = pIVar36->did_external_prop;
  pFVar2 = (FILE *)(pIVar36->reluctant).v;
  pcVar33 = (char *)CONCAT71((int7)((ulong)pcVar33 >> 8),pFVar2 == (FILE *)0x0 || lVar14 == 0);
  if (pFVar2 != (FILE *)0x0 && lVar14 != 0) {
    fprintf(pFVar2,"%s\n","conclude");
    fflush((FILE *)(pIVar36->reluctant).v);
  }
  pcVar34 = "void CaDiCaL::Solver::conclude()";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar36,"void CaDiCaL::Solver::conclude()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar33);
  pEVar22 = *(External **)&pIVar36->external_prop_is_lazy;
  if (pEVar22 == (External *)0x0) {
    conclude();
LAB_0085fa79:
    conclude();
  }
  else {
    if (*(Internal **)&pIVar36->preprocessing == (Internal *)0x0) goto LAB_0085fa79;
    uVar1._0_1_ = pIVar36->unsat;
    uVar1._1_1_ = pIVar36->iterating;
    uVar1._2_1_ = pIVar36->localsearching;
    uVar1._3_1_ = pIVar36->lookingahead;
    if ((uVar1 & 0x6e) != 0) {
      if (uVar1 == 4) {
        External::conclude_unknown(pEVar22);
        return (bool)extraout_AL_14;
      }
      if (uVar1 == 0x20) {
        External::conclude_sat(pEVar22);
        return (bool)extraout_AL_13;
      }
      if (uVar1 == 0x40) {
        Internal::conclude_unsat(*(Internal **)&pIVar36->preprocessing);
        return (bool)extraout_AL_12;
      }
      goto LAB_0085fa83;
    }
  }
  conclude();
LAB_0085fa83:
  conclude();
  bVar37 = _stderr != pEVar22;
  if (bVar37) {
    this_01 = (undefined1 *)0x0;
  }
  else {
    this_01 = terr;
  }
  bVar38 = _stdout == pEVar22;
  if (bVar38) {
    this_01 = tout;
  }
  pcVar33 = CaDiCaL::version();
  pcVar35 = identifier();
  __s = compiler();
  __s_00 = date();
  __s_01 = flags();
  fputs(pcVar34,(FILE *)pEVar22);
  if (bVar38 || !bVar37) {
    Terminal::color((Terminal *)this_01,0x23,false);
    fputs("Version ",(FILE *)pEVar22);
    Terminal::code((Terminal *)this_01,"0m");
  }
  else {
    fputs("Version ",(FILE *)pEVar22);
  }
  fputs(pcVar33,(FILE *)pEVar22);
  if (pcVar35 != (char *)0x0) {
    if (bVar38 || !bVar37) {
      Terminal::color((Terminal *)this_01,0x23,false);
      fputc(0x20,(FILE *)pEVar22);
      fputs(pcVar35,(FILE *)pEVar22);
      Terminal::code((Terminal *)this_01,"0m");
    }
    else {
      fputc(0x20,(FILE *)pEVar22);
      fputs(pcVar35,(FILE *)pEVar22);
    }
  }
  fputc(10,(FILE *)pEVar22);
  if (__s != (char *)0x0) {
    fputs(pcVar34,(FILE *)pEVar22);
    if (bVar38 || !bVar37) {
      Terminal::color((Terminal *)this_01,0x23,false);
    }
    fputs(__s,(FILE *)pEVar22);
    if (__s_01 != (char *)0x0) {
      fputc(0x20,(FILE *)pEVar22);
      fputs(__s_01,(FILE *)pEVar22);
    }
    if (bVar38 || !bVar37) {
      Terminal::code((Terminal *)this_01,"0m");
    }
    fputc(10,(FILE *)pEVar22);
  }
  if (__s_00 != (char *)0x0) {
    fputs(pcVar34,(FILE *)pEVar22);
    if (bVar38 || !bVar37) {
      Terminal::color((Terminal *)this_01,0x23,false);
      fputs(__s_00,(FILE *)pEVar22);
      Terminal::code((Terminal *)this_01,"0m");
    }
    else {
      fputs(__s_00,(FILE *)pEVar22);
    }
    fputc(10,(FILE *)pEVar22);
  }
  iVar19 = fflush((FILE *)pEVar22);
  return SUB41(iVar19,0);
}

Assistant:

bool Solver::flip (int lit) {
  TRACE ("flip", lit);
  REQUIRE_VALID_STATE ();
  REQUIRE_VALID_LIT (lit);
  REQUIRE (state () == SATISFIED, "can only flip value in satisfied state");
  REQUIRE (!external->propagator,
           "can only flip when no external propagator is present");
  bool res = external->flip (lit);
  LOG_API_CALL_RETURNS ("flip", lit, res);
  assert (state () == SATISFIED);
  return res;
}